

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O1

bool checkMergeDels(string *chr1,int st1,int en1,string *chr2,int st2,int en2,double RO)

{
  size_t __n;
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  __n = chr1->_M_string_length;
  if (__n == chr2->_M_string_length) {
    if (__n != 0) {
      iVar2 = bcmp((chr1->_M_dataplus)._M_p,(chr2->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_001844c6;
    }
    uVar3 = st1 - st2;
    iVar2 = st2;
    if (uVar3 != 0 && st2 <= st1) {
      iVar2 = st1;
    }
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    uVar3 = en2 - en1;
    iVar5 = en1;
    if (en2 < en1) {
      iVar5 = en2;
    }
    if ((int)uVar3 < 0) {
      uVar3 = -uVar3;
    }
    bVar1 = -(RO <= (double)(iVar5 - iVar2) / (double)(en2 - st2)) &
            -(RO <= (double)(iVar5 - iVar2) / (double)(en1 - st1)) | (uVar3 < 6 && uVar4 < 6);
  }
  else {
LAB_001844c6:
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool checkMergeDels(const std::string &chr1, int st1, int en1, const std::string &chr2, int st2, int en2, double RO)
{
	if (chr1 != chr2)
		return false;
	bool closeEnough = (abs(st1 - st2) <= DEL_MERGE_DIS) & (abs(en1 - en2) <= DEL_MERGE_DIS);
	double overlap = 1.0 * (std::min(en1, en2) - std::max(st1, st2));
	double len1 = 1.0 * (en1 - st1);
	double len2 = 1.0 * (en2 - st2);
	double ro1 = overlap / len1;
	double ro2 = overlap / len2;
	return ((ro1 >= RO && ro2 >= RO) | closeEnough);
}